

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_blend_popcnt(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  byte bVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  long lVar38;
  ulong uVar39;
  int j;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  
  auVar37 = _DAT_001202e0;
  auVar36 = _DAT_001202c0;
  uVar39 = 0;
  while (uVar1 = uVar39 + 2, uVar1 <= len >> 4) {
    auVar40 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar39 * 0x10),auVar36,
                                *(undefined1 (*) [32])(array + uVar39 * 0x10 + 0x10));
    auVar41 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar39 * 0x10 + 0x10),auVar37,
                                *(undefined1 (*) [32])(array + uVar39 * 0x10));
    for (lVar38 = 0x20; uVar39 = uVar1, lVar38 != 0; lVar38 = lVar38 + -4) {
      auVar4 = auVar40 >> 7;
      auVar5 = auVar40 >> 0xf;
      auVar6 = auVar40 >> 0x17;
      auVar7 = auVar40 >> 0x1f;
      auVar8 = auVar40 >> 0x27;
      auVar9 = auVar40 >> 0x2f;
      auVar10 = auVar40 >> 0x37;
      auVar11 = auVar40 >> 0x3f;
      auVar12 = auVar40 >> 0x47;
      auVar13 = auVar40 >> 0x4f;
      auVar14 = auVar40 >> 0x57;
      auVar15 = auVar40 >> 0x5f;
      auVar16 = auVar40 >> 0x67;
      auVar17 = auVar40 >> 0x6f;
      auVar18 = auVar40 >> 0x77;
      auVar19 = auVar40 >> 0x7f;
      auVar20 = auVar40 >> 0x87;
      auVar21 = auVar40 >> 0x8f;
      auVar22 = auVar40 >> 0x97;
      auVar23 = auVar40 >> 0x9f;
      auVar24 = auVar40 >> 0xa7;
      auVar25 = auVar40 >> 0xaf;
      auVar26 = auVar40 >> 0xb7;
      auVar27 = auVar40 >> 0xbf;
      auVar28 = auVar40 >> 199;
      auVar29 = auVar40 >> 0xcf;
      auVar30 = auVar40 >> 0xd7;
      auVar31 = auVar40 >> 0xdf;
      auVar32 = auVar40 >> 0xe7;
      auVar33 = auVar40 >> 0xef;
      auVar34 = auVar40 >> 0xf7;
      bVar35 = auVar40[0x1f];
      auVar40 = vpaddb_avx2(auVar40,auVar40);
      piVar2 = (int *)((long)flags + lVar38 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar5[0] & 1) << 1 |
                                   (uint)(auVar6[0] & 1) << 2 | (uint)(auVar7[0] & 1) << 3 |
                                   (uint)(auVar8[0] & 1) << 4 | (uint)(auVar9[0] & 1) << 5 |
                                   (uint)(auVar10[0] & 1) << 6 | (uint)(auVar11[0] & 1) << 7 |
                                   (uint)(auVar12[0] & 1) << 8 | (uint)(auVar13[0] & 1) << 9 |
                                   (uint)(auVar14[0] & 1) << 10 | (uint)(auVar15[0] & 1) << 0xb |
                                   (uint)(auVar16[0] & 1) << 0xc | (uint)(auVar17[0] & 1) << 0xd |
                                   (uint)(auVar18[0] & 1) << 0xe | (uint)auVar19[0] << 0xf |
                                   (uint)(auVar20[0] & 1) << 0x10 | (uint)(auVar21[0] & 1) << 0x11 |
                                   (uint)(auVar22[0] & 1) << 0x12 | (uint)(auVar23[0] & 1) << 0x13 |
                                   (uint)(auVar24[0] & 1) << 0x14 | (uint)(auVar25[0] & 1) << 0x15 |
                                   (uint)(auVar26[0] & 1) << 0x16 | (uint)auVar27[0] << 0x17 |
                                   (uint)(auVar28[0] & 1) << 0x18 | (uint)(auVar29[0] & 1) << 0x19 |
                                   (uint)(auVar30[0] & 1) << 0x1a | (uint)(auVar31[0] & 1) << 0x1b |
                                   (uint)(auVar32[0] & 1) << 0x1c | (uint)(auVar33[0] & 1) << 0x1d |
                                   (uint)(auVar34[0] & 1) << 0x1e | (uint)(bVar35 >> 7) << 0x1f);
      auVar4 = auVar41 >> 7;
      auVar5 = auVar41 >> 0xf;
      auVar6 = auVar41 >> 0x17;
      auVar7 = auVar41 >> 0x1f;
      auVar8 = auVar41 >> 0x27;
      auVar9 = auVar41 >> 0x2f;
      auVar10 = auVar41 >> 0x37;
      auVar11 = auVar41 >> 0x3f;
      auVar12 = auVar41 >> 0x47;
      auVar13 = auVar41 >> 0x4f;
      auVar14 = auVar41 >> 0x57;
      auVar15 = auVar41 >> 0x5f;
      auVar16 = auVar41 >> 0x67;
      auVar17 = auVar41 >> 0x6f;
      auVar18 = auVar41 >> 0x77;
      auVar19 = auVar41 >> 0x7f;
      auVar20 = auVar41 >> 0x87;
      auVar21 = auVar41 >> 0x8f;
      auVar22 = auVar41 >> 0x97;
      auVar23 = auVar41 >> 0x9f;
      auVar24 = auVar41 >> 0xa7;
      auVar25 = auVar41 >> 0xaf;
      auVar26 = auVar41 >> 0xb7;
      auVar27 = auVar41 >> 0xbf;
      auVar28 = auVar41 >> 199;
      auVar29 = auVar41 >> 0xcf;
      auVar30 = auVar41 >> 0xd7;
      auVar31 = auVar41 >> 0xdf;
      auVar32 = auVar41 >> 0xe7;
      auVar33 = auVar41 >> 0xef;
      auVar34 = auVar41 >> 0xf7;
      bVar35 = auVar41[0x1f];
      auVar41 = vpaddb_avx2(auVar41,auVar41);
      piVar2 = (int *)((long)flags + lVar38 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar5[0] & 1) << 1 |
                                   (uint)(auVar6[0] & 1) << 2 | (uint)(auVar7[0] & 1) << 3 |
                                   (uint)(auVar8[0] & 1) << 4 | (uint)(auVar9[0] & 1) << 5 |
                                   (uint)(auVar10[0] & 1) << 6 | (uint)(auVar11[0] & 1) << 7 |
                                   (uint)(auVar12[0] & 1) << 8 | (uint)(auVar13[0] & 1) << 9 |
                                   (uint)(auVar14[0] & 1) << 10 | (uint)(auVar15[0] & 1) << 0xb |
                                   (uint)(auVar16[0] & 1) << 0xc | (uint)(auVar17[0] & 1) << 0xd |
                                   (uint)(auVar18[0] & 1) << 0xe | (uint)auVar19[0] << 0xf |
                                   (uint)(auVar20[0] & 1) << 0x10 | (uint)(auVar21[0] & 1) << 0x11 |
                                   (uint)(auVar22[0] & 1) << 0x12 | (uint)(auVar23[0] & 1) << 0x13 |
                                   (uint)(auVar24[0] & 1) << 0x14 | (uint)(auVar25[0] & 1) << 0x15 |
                                   (uint)(auVar26[0] & 1) << 0x16 | (uint)auVar27[0] << 0x17 |
                                   (uint)(auVar28[0] & 1) << 0x18 | (uint)(auVar29[0] & 1) << 0x19 |
                                   (uint)(auVar30[0] & 1) << 0x1a | (uint)(auVar31[0] & 1) << 0x1b |
                                   (uint)(auVar32[0] & 1) << 0x1c | (uint)(auVar33[0] & 1) << 0x1d |
                                   (uint)(auVar34[0] & 1) << 0x1e | (uint)(bVar35 >> 7) << 0x1f);
    }
  }
  for (uVar39 = uVar39 << 4; uVar39 < len; uVar39 = uVar39 + 1) {
    uVar3 = array[uVar39];
    for (lVar38 = 0; lVar38 != 0x10; lVar38 = lVar38 + 1) {
      flags[lVar38] = flags[lVar38] + (uint)((uVar3 >> ((uint)lVar38 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m256i v0 = _mm256_loadu_si256(data_vectors + i + 0);
        __m256i v1 = _mm256_loadu_si256(data_vectors + i + 1);
        __m256i input0 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v1, 8));
        __m256i input1 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v1, 8));
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input0));
            flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input1));
            input0 = _mm256_add_epi8(input0, input0);
            input1 = _mm256_add_epi8(input1, input1);
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
   
    return 0;
}